

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O2

void __thiscall
fizplex::LPTestFeasibility_IsFeasibleForFreeVarAndRangeRow_Test::
~LPTestFeasibility_IsFeasibleForFreeVarAndRangeRow_Test
          (LPTestFeasibility_IsFeasibleForFreeVarAndRangeRow_Test *this)

{
  LPTestFeasibility::~LPTestFeasibility(&this->super_LPTestFeasibility);
  operator_delete(this,0x98);
  return;
}

Assistant:

TEST_F(LPTestFeasibility, IsFeasibleForFreeVarAndRangeRow) {
  lp.add_column(ColType::Free, -inf, inf);
  lp.add_row(RowType::Range, -5, 5);
  lp.add_value(0, 0, 1.0);
  lp.add_logicals();

  check_feasible(true, {{0, 5}, {-5, 10}, {5, 0}});
  check_feasible(false, {{-6, 1}, {6, -1}});
}